

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<true,_true,_false>::change_branch_(DaTrie<true,_true,_false> *this,Query *query)

{
  vector<char,_std::allocator<char>_> *this_00;
  char cVar1;
  pointer pBVar2;
  pointer pcVar3;
  uint32_t node_pos;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  uint8_t local_139;
  Edge edge;
  
  memset(&edge,0,0x108);
  edge_(this,query->node_pos_,&edge,2);
  if (edge.size_ == 1) {
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (uint)edge.labels_[0] ^ *(uint *)(pBVar2 + query->node_pos_) & 0x7fffffff;
    uVar7 = SUB84(pBVar2[uVar5],0);
    if ((int)uVar7 < 0) {
      uVar7 = uVar7 & 0x7fffffff;
      unfix_(this,uVar5,&this->blocks_);
      uVar5 = query->node_pos_;
      lVar6 = 0;
      while (uVar5 != 0) {
        uVar5 = *(uint *)&(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar5].field_0x4 & 0x7fffffff;
        sVar4 = edge_size_(this,uVar5,2);
        node_pos = query->node_pos_;
        if (sVar4 != 1) goto LAB_00122a55;
        delete_sib_(this,node_pos);
        unfix_(this,query->node_pos_,&this->blocks_);
        query->node_pos_ = uVar5;
        query->is_finished_ = false;
        query->pos_ = query->pos_ - 1;
        lVar6 = lVar6 + -1;
      }
      node_pos = 0;
LAB_00122a55:
      pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      this_00 = &this->tail_;
      pBVar2[node_pos] =
           (Bc)(CONCAT44(*(undefined4 *)&pBVar2[node_pos].field_0x4,
                         *(int *)&(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                         *(int *)&(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) | 0x80000000);
      for (; lVar6 != 0; lVar6 = lVar6 + 1) {
        std::vector<char,_std::allocator<char>_>::push_back(this_00,query->key_ + query->pos_);
        Query::next(query);
      }
      local_139 = edge.labels_[0];
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(this_00,(char *)&local_139);
      if (edge.labels_[0] == '\0') {
        lVar6 = 4;
        while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
          local_139 = (uint8_t)uVar7;
          std::vector<char,_std::allocator<char>_>::emplace_back<char>(this_00,(char *)&local_139);
          uVar7 = uVar7 >> 8;
        }
      }
      else {
        for (; pcVar3 = (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_start, cVar1 = pcVar3[uVar7],
            std::vector<char,_std::allocator<char>_>::push_back(this_00,pcVar3 + uVar7),
            cVar1 != '\0'; uVar7 = uVar7 + 1) {
          this->tail_emps_ = this->tail_emps_ + 1;
        }
        this->tail_emps_ = this->tail_emps_ + 1;
        lVar6 = 4;
        while( true ) {
          uVar7 = uVar7 + 1;
          bVar8 = lVar6 == 0;
          lVar6 = lVar6 + -1;
          if (bVar8) break;
          std::vector<char,_std::allocator<char>_>::push_back
                    (this_00,(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar7);
          this->tail_emps_ = this->tail_emps_ + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void change_branch_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    Edge edge;
    edge_(query.node_pos(), edge, 2);

    if (edge.size() != 1) {
      return;
    }

    auto child_pos = bc_[query.node_pos()].base() ^*edge.begin();
    if (!bc_[child_pos].is_leaf()) {
      return;
    }

    auto value = bc_[child_pos].value();
    unfix_(child_pos, blocks_);

    size_t num_regress = 0;
    while (query.node_pos() != ROOT_POS) {
      auto parent_pos = bc_[query.node_pos()].check();
      if (edge_size_(parent_pos, 2) != 1) {
        break;
      }
      if (WithNLM) {
        delete_sib_(query.node_pos());
      }
      unfix_(query.node_pos(), blocks_);
      query.prev(parent_pos);
      ++num_regress;
    }

    bc_[query.node_pos()].set_value(tail_size());
    while (0 < num_regress--) {
      tail_.push_back(*query.key());
      query.next();
    }
    tail_.push_back(*edge.begin());

    if (*edge.begin() != '\0') {
      while (tail_[value] != '\0') {
        tail_.push_back(tail_[value++]);
        ++tail_emps_;
      }
      tail_.push_back(tail_[value++]);
      ++tail_emps_;
      for (size_t i = 0; i < sizeof(uint32_t); ++i) {
        tail_.push_back(tail_[value++]);
        ++tail_emps_;
      }
    } else {
      for (size_t i = 0; i < sizeof(uint32_t); ++i) {
        tail_.push_back(static_cast<uint8_t>(value & 0xFF));
        value >>= 8;
      }
    }
  }